

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::SupportVectorClassifier::ByteSizeLong(SupportVectorClassifier *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  Type *pTVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  sVar4 = google::protobuf::internal::WireFormatLite::Int32Size
                    (&this->numberofsupportvectorsperclass_);
  if (sVar4 == 0) {
    uVar3 = 0;
    uVar7 = 0;
  }
  else {
    uVar3 = (uint)sVar4;
    if ((int)uVar3 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_numberofsupportvectorsperclass_cached_byte_size_ = uVar3;
  uVar3 = (this->coefficients_).super_RepeatedPtrFieldBase.current_size_;
  lVar10 = uVar7 + sVar4 + (ulong)uVar3;
  if ((ulong)uVar3 != 0) {
    uVar9 = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
                         (&(this->coefficients_).super_RepeatedPtrFieldBase,uVar9);
      uVar7 = (ulong)(uint)(pTVar5->alpha_).current_size_;
      lVar8 = uVar7 * 8;
      if (uVar7 == 0) {
        uVar2 = 0;
        uVar7 = 0;
      }
      else {
        uVar2 = (uint)lVar8;
        if ((int)uVar2 < 0) {
          uVar7 = 0xb;
        }
        else {
          iVar1 = 0x1f;
          if ((uVar2 | 1) != 0) {
            for (; (uVar2 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
            }
          }
          uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
        }
      }
      pTVar5->_alpha_cached_byte_size_ = uVar2;
      lVar8 = uVar7 + lVar8;
      uVar2 = (uint)lVar8;
      pTVar5->_cached_size_ = uVar2;
      uVar2 = uVar2 | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      lVar10 = lVar10 + lVar8 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
  uVar7 = (ulong)(uint)(this->rho_).current_size_;
  lVar8 = uVar7 * 8;
  uVar3 = 0;
  if (uVar7 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = (uint)lVar8;
    if ((int)uVar9 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar9 | 1) != 0) {
        for (; (uVar9 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    lVar10 = lVar10 + uVar7;
  }
  this->_rho_cached_byte_size_ = uVar9;
  lVar10 = lVar10 + lVar8;
  uVar7 = (ulong)(uint)(this->proba_).current_size_;
  lVar8 = uVar7 * 8;
  if (uVar7 != 0) {
    uVar3 = (uint)lVar8;
    if ((int)uVar3 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    lVar10 = lVar10 + uVar7;
  }
  this->_proba_cached_byte_size_ = uVar3;
  lVar10 = lVar10 + lVar8;
  uVar7 = (ulong)(uint)(this->probb_).current_size_;
  lVar8 = uVar7 * 8;
  if (uVar7 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)lVar8;
    if ((int)uVar3 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    lVar10 = lVar10 + uVar7;
  }
  this->_probb_cached_byte_size_ = uVar3;
  sVar4 = lVar10 + lVar8;
  if (this->kernel_ != (Kernel *)0x0 &&
      this != (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) {
    sVar6 = Kernel::ByteSizeLong(this->kernel_);
    uVar3 = (uint)sVar6 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar4 = sVar4 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->_oneof_case_[0] == 4) {
    sVar6 = DenseSupportVectors::ByteSizeLong((this->supportVectors_).densesupportvectors_);
LAB_0024ecbf:
    uVar3 = (uint)sVar6 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar4 = sVar4 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  else if (this->_oneof_case_[0] == 3) {
    sVar6 = SparseSupportVectors::ByteSizeLong((this->supportVectors_).sparsesupportvectors_);
    goto LAB_0024ecbf;
  }
  if (this->_oneof_case_[1] == 0x65) {
    sVar6 = Int64Vector::ByteSizeLong((this->ClassLabels_).int64classlabels_);
  }
  else {
    if (this->_oneof_case_[1] != 100) goto LAB_0024ed1a;
    sVar6 = StringVector::ByteSizeLong((this->ClassLabels_).stringclasslabels_);
  }
  uVar3 = (uint)sVar6 | 1;
  iVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar4 = sVar4 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
LAB_0024ed1a:
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t SupportVectorClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SupportVectorClassifier)
  size_t total_size = 0;

  // repeated int32 numberOfSupportVectorsPerClass = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->numberofsupportvectorsperclass_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _numberofsupportvectorsperclass_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated .CoreML.Specification.Coefficients coefficients = 5;
  {
    unsigned int count = this->coefficients_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->coefficients(i));
    }
  }

  // repeated double rho = 6;
  {
    unsigned int count = this->rho_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _rho_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double probA = 7;
  {
    unsigned int count = this->proba_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _proba_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double probB = 8;
  {
    unsigned int count = this->probb_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _probb_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->kernel_);
  }

  switch (supportVectors_case()) {
    // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 3;
    case kSparseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.sparsesupportvectors_);
      break;
    }
    // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 4;
    case kDenseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.densesupportvectors_);
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}